

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O3

string * __thiscall
libtorrent::aux::address_to_bytes_abi_cxx11_(string *__return_storage_ptr__,aux *this,address *a)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20.container = __return_storage_ptr__;
  write_address<std::back_insert_iterator<std::__cxx11::string>&>((address *)this,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string address_to_bytes(address const& a)
	{
		std::string ret;
		std::back_insert_iterator<std::string> out(ret);
		aux::write_address(a, out);
		return ret;
	}